

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O2

bool board::evaluate::materialDraw(Board *pos)

{
  uint uVar1;
  uint uVar2;
  
  if ((((pos->pNum[4] == 0) && (pos->pNum[10] == 0)) && (pos->pNum[5] == 0)) &&
     (((pos->pNum[0xb] == 0 && (pos->pNum[1] == 0)) && (pos->pNum[7] == 0)))) {
    if (pos->pNum[9] == 0 && pos->pNum[3] == 0) {
      if (pos->pNum[2] < 3 && pos->pNum[8] < 3) {
        return true;
      }
    }
    else if (pos->pNum[2] == 0 && pos->pNum[8] == 0) {
      uVar2 = pos->pNum[3] - pos->pNum[9];
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      if (uVar1 < 2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool board::evaluate::materialDraw(Board& pos)
{
    if (!pos.getPieceNum(WR) && !pos.getPieceNum(BR) && !pos.getPieceNum(WQ) && !pos.getPieceNum(BQ) &&
        !pos.getPieceNum(WP) && !pos.getPieceNum(BP)) {
        if (!pos.getPieceNum(BB) && !pos.getPieceNum(WB)) {
            if (pos.getPieceNum(WN) < 3 && pos.getPieceNum(BN) < 3) {
                return true;
            }
        }
        else if (!pos.getPieceNum(WN) && !pos.getPieceNum(BN)) {
            if (abs(pos.getPieceNum(WB) - pos.getPieceNum(BB)) < 2) {
                return true;
            }
        }
    }
    return false;
}